

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  size_t sVar3;
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ptls_hash_context_t **pppVar8;
  size_t sVar9;
  size_t sVar10;
  
  iVar5 = (*emitter->begin_message)(emitter);
  if (iVar5 == 0) {
    buf = emitter->buf;
    ppVar2 = tls->key_schedule;
    sVar3 = buf->off;
    iVar5 = ptls_buffer_reserve_aligned(buf,1,'\0');
    if (iVar5 == 0) {
      buf->base[buf->off] = '\x14';
      buf->off = buf->off + 1;
      iVar5 = ptls_buffer_reserve_aligned(buf,3,'\0');
      if (iVar5 == 0) {
        puVar4 = buf->base;
        sVar9 = buf->off;
        puVar4[sVar9 + 2] = '\0';
        puVar4 = puVar4 + sVar9;
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        sVar9 = buf->off;
        buf->off = sVar9 + 3;
        iVar5 = ptls_buffer_reserve_aligned
                          (emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size,'\0');
        if (iVar5 == 0) {
          iVar5 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                   &(tls->traffic_protection).enc);
          if (iVar5 == 0) {
            psVar1 = &emitter->buf->off;
            *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
            uVar7 = buf->off - (sVar9 + 3);
            iVar5 = 0x20c;
            if (uVar7 < 0x1000000) {
              lVar6 = 0x10;
              do {
                buf->base[sVar9] = (uint8_t)(uVar7 >> ((byte)lVar6 & 0x3f));
                lVar6 = lVar6 + -8;
                sVar9 = sVar9 + 1;
              } while (lVar6 != -8);
              if ((ppVar2 != (ptls_key_schedule_t *)0x0) && (ppVar2->num_hashes != 0)) {
                puVar4 = buf->base;
                sVar9 = buf->off;
                pppVar8 = &ppVar2->hashes[0].ctx;
                sVar10 = 0;
                do {
                  (*(*pppVar8)->update)(*pppVar8,puVar4 + sVar3,sVar9 - sVar3);
                  sVar10 = sVar10 + 1;
                  pppVar8 = pppVar8 + 3;
                } while (sVar10 != ppVar2->num_hashes);
              }
              iVar5 = (*emitter->commit_message)(emitter);
              return iVar5;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}